

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::write_codepoint<8ul,char,fmt::v10::appender>
                   (appender out,char prefix,uint32_t cp)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  char buf [8];
  char local_20 [8];
  
  lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10);
  uVar4 = lVar2 + 1;
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x18) < uVar4) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar4 = lVar2 + 1;
  }
  *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
       = uVar4;
  *(undefined1 *)
   (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 8) +
   lVar2) = 0x5c;
  lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10);
  uVar4 = lVar2 + 1;
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x18) < uVar4) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar4 = lVar2 + 1;
  }
  *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
       = uVar4;
  *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 8) + lVar2) = prefix;
  builtin_strncpy(local_20,"00000000",8);
  pcVar3 = local_20 + 7;
  do {
    *pcVar3 = "0123456789abcdef"[cp & 0xf];
    pcVar3 = pcVar3 + -1;
    bVar1 = 0xf < cp;
    cp = cp >> 4;
  } while (bVar1);
  buffer<char>::append<char>
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,local_20,
             &stack0xffffffffffffffe8);
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}